

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

bool __thiscall CppGenerator::resortView(CppGenerator *this,size_t *inc_view_id,size_t *view_id)

{
  ulong *puVar1;
  size_t sVar2;
  size_t **ppsVar3;
  View *pVVar4;
  size_t sVar5;
  long lVar6;
  size_t *var;
  ulong *puVar7;
  bool bVar8;
  bool bVar9;
  
  pVVar4 = QueryCompiler::getView
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,*inc_view_id);
  puVar7 = this->variableOrder[*view_id].
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = this->variableOrder[*view_id].
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar8 = puVar7 != puVar1;
  if (bVar8) {
    lVar6 = 0;
    do {
      if (((pVVar4->_fVars).super__Base_bitset<2UL>._M_w[*puVar7 >> 6] >> (*puVar7 & 0x3f) & 1) == 0
         ) {
        bVar9 = true;
      }
      else {
        sVar2 = *inc_view_id;
        ppsVar3 = this->sortOrders;
        sVar5 = TreeDecomposition::numberOfRelations
                          ((this->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
        bVar9 = ppsVar3[sVar2 + sVar5][lVar6] == *puVar7;
        lVar6 = lVar6 + (ulong)bVar9;
      }
      if (!bVar9) {
        return bVar8;
      }
      puVar7 = puVar7 + 1;
      bVar8 = puVar7 != puVar1;
    } while (bVar8);
  }
  return bVar8;
}

Assistant:

bool CppGenerator::resortView(const size_t& inc_view_id, const size_t& view_id)
{
    View* view = _qc->getView(inc_view_id);
    size_t orderIdx = 0;
    for (const size_t& var : variableOrder[view_id])
    {
        if (view->_fVars[var])
        {
            if (sortOrders[inc_view_id+_td->numberOfRelations()][orderIdx] != var)
                return true;
            ++orderIdx;
        }
    }

    return false;
}